

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O3

_Bool check_serialization(roaring_bitmap_t *bitmap)

{
  _Bool _Var1;
  size_t __size;
  char *buf;
  roaring_bitmap_t *r2;
  
  __size = roaring_bitmap_portable_size_in_bytes(bitmap);
  buf = (char *)malloc(__size);
  roaring_bitmap_portable_serialize(bitmap,buf);
  r2 = roaring_bitmap_portable_deserialize(buf);
  _Var1 = roaring_bitmap_equals(bitmap,r2);
  roaring_bitmap_free(r2);
  free(buf);
  return _Var1;
}

Assistant:

bool check_serialization(roaring_bitmap_t *bitmap) {
    const size_t size = roaring_bitmap_portable_size_in_bytes(bitmap);
    char *data = (char *)malloc(size);
    roaring_bitmap_portable_serialize(bitmap, data);
    roaring_bitmap_t *deserializedBitmap =
        roaring_bitmap_portable_deserialize(data);
    bool ret = roaring_bitmap_equals(bitmap, deserializedBitmap);
    roaring_bitmap_free(deserializedBitmap);
    free(data);
    return ret;
}